

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

TableFunction * duckdb::TableScanFunction::GetFunction(void)

{
  TableFunction *in_RDI;
  allocator local_49;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"seq_scan",&local_49);
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_48,TableScanFunc,
             (table_function_bind_t)0x0,(table_function_init_global_t)0x0,
             (table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  ::std::__cxx11::string::~string((string *)&local_30);
  in_RDI->init_local = TableScanInitLocal;
  in_RDI->init_global = TableScanInitGlobal;
  in_RDI->statistics = TableScanStatistics;
  in_RDI->dependency = TableScanDependency;
  in_RDI->cardinality = TableScanCardinality;
  in_RDI->pushdown_complex_filter = (table_function_pushdown_complex_filter_t)0x0;
  in_RDI->to_string = TableScanToString_abi_cxx11_;
  in_RDI->table_scan_progress = TableScanProgress;
  in_RDI->get_partition_data = TableScanGetPartitionData;
  in_RDI->get_partition_stats = TableScanGetPartitionStats;
  in_RDI->get_bind_info = TableScanGetBindInfo;
  in_RDI->projection_pushdown = true;
  in_RDI->filter_pushdown = true;
  in_RDI->filter_prune = true;
  in_RDI->sampling_pushdown = true;
  in_RDI->late_materialization = true;
  in_RDI->serialize = TableScanSerialize;
  in_RDI->deserialize = TableScanDeserialize;
  in_RDI->pushdown_expression = TableScanPushdownExpression;
  in_RDI->get_virtual_columns = TableScanGetVirtualColumns;
  return in_RDI;
}

Assistant:

TableFunction TableScanFunction::GetFunction() {
	TableFunction scan_function("seq_scan", {}, TableScanFunc);
	scan_function.init_local = TableScanInitLocal;
	scan_function.init_global = TableScanInitGlobal;
	scan_function.statistics = TableScanStatistics;
	scan_function.dependency = TableScanDependency;
	scan_function.cardinality = TableScanCardinality;
	scan_function.pushdown_complex_filter = nullptr;
	scan_function.to_string = TableScanToString;
	scan_function.table_scan_progress = TableScanProgress;
	scan_function.get_partition_data = TableScanGetPartitionData;
	scan_function.get_partition_stats = TableScanGetPartitionStats;
	scan_function.get_bind_info = TableScanGetBindInfo;
	scan_function.projection_pushdown = true;
	scan_function.filter_pushdown = true;
	scan_function.filter_prune = true;
	scan_function.sampling_pushdown = true;
	scan_function.late_materialization = true;
	scan_function.serialize = TableScanSerialize;
	scan_function.deserialize = TableScanDeserialize;
	scan_function.pushdown_expression = TableScanPushdownExpression;
	scan_function.get_virtual_columns = TableScanGetVirtualColumns;
	return scan_function;
}